

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  byte local_19;
  bool DumpToFileAppend_result;
  bool DumpToFile_result;
  bool ArrayAllocation_result;
  bool MultipleAllocations_result;
  bool BasicTest_result;
  char **ppcStack_18;
  bool allTestsPassed;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_19 = 1;
  local_1a = true;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  BasicTest(&local_1a);
  if ((local_1a & 1U) != 0) {
    printf("%-30s: PASSED\n","BasicTest");
  }
  local_19 = (local_19 & 1 & local_1a & 1U) != 0;
  local_1b = true;
  MultipleAllocations(&local_1b);
  if ((local_1b & 1U) != 0) {
    printf("%-30s: PASSED\n","MultipleAllocations");
  }
  local_19 = (local_19 & 1 & local_1b & 1U) != 0;
  local_1c = true;
  ArrayAllocation(&local_1c);
  if ((local_1c & 1U) != 0) {
    printf("%-30s: PASSED\n","ArrayAllocation");
  }
  local_19 = (local_19 & 1 & local_1c & 1U) != 0;
  local_1d = true;
  DumpToFile(&local_1d);
  if ((local_1d & 1U) != 0) {
    printf("%-30s: PASSED\n","DumpToFile");
  }
  local_19 = (local_19 & 1 & local_1d & 1U) != 0;
  local_1e = true;
  DumpToFileAppend(&local_1e);
  if ((local_1e & 1U) != 0) {
    printf("%-30s: PASSED\n","DumpToFileAppend");
  }
  local_19 = (local_19 & 1 & local_1e & 1U) != 0;
  bVar1 = !(bool)local_19;
  if (bVar1) {
    printf("NOT ALL TESTS PASSED!!\n\n\n");
  }
  else {
    printf("ALL TESTS PASSED!!\n\n\n");
  }
  argv_local._4_4_ = (uint)bVar1;
  return argv_local._4_4_;
}

Assistant:

int MAIN(int argc, char* argv[]) {

    START_RUNNING_TESTS;
    
    RUN_TEST(BasicTest);
    
    #if !defined _MSC_VER || !defined _DEBUG
    RUN_TEST(MultipleAllocations);
    RUN_TEST(ArrayAllocation);
    #else
    SKIP_TEST(MultipleAllocations, "Additional debug allocations made by VS make it difficult to track real memory allocations");
    SKIP_TEST(ArrayAllocation, "Additional debug allocations made by VS make it difficult to track real memory allocations");
    #endif

    RUN_TEST(DumpToFile);
    RUN_TEST(DumpToFileAppend);

    END_RUNNING_TESTS;
}